

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void totalFinalize(sqlite3_context *context)

{
  double *pdVar1;
  undefined8 local_28;
  SumCtx *p;
  sqlite3_context *context_local;
  
  pdVar1 = (double *)sqlite3_aggregate_context(context,0);
  if (pdVar1 == (double *)0x0) {
    local_28 = 0.0;
  }
  else {
    local_28 = *pdVar1;
  }
  sqlite3_result_double(context,local_28);
  return;
}

Assistant:

static void totalFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
  sqlite3_result_double(context, p ? p->rSum : (double)0);
}